

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O2

void xercesc_4_0::XMLString::trim(XMLCh *toTrim)

{
  XMLSize_t XVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  ulong uVar4;
  XMLSize_t XVar5;
  
  XVar1 = stringLen(toTrim);
  XVar2 = 0;
  while ((XVar3 = XVar1, XVar1 != XVar2 &&
         (XVar3 = XVar2, (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toTrim[XVar2]] < '\0'))) {
    XVar2 = XVar2 + 1;
  }
  XVar2 = XVar1;
  uVar4 = XVar3;
  if (XVar1 < XVar3) {
    uVar4 = XVar1;
  }
  while ((XVar5 = uVar4, XVar3 < XVar2 &&
         (XVar5 = XVar2, (char)(&XMLChar1_0::fgCharCharsTable1_0)[(ushort)toTrim[XVar2 - 1]] < '\0')
         )) {
    XVar2 = XVar2 - 1;
  }
  if (XVar5 != XVar1) {
    toTrim[XVar5] = L'\0';
  }
  if (XVar3 != 0) {
    for (; toTrim[XVar3] != L'\0'; toTrim = toTrim + 1) {
      *toTrim = toTrim[XVar3];
    }
    *toTrim = L'\0';
  }
  return;
}

Assistant:

void XMLString::trim(XMLCh* const toTrim)
{
    const XMLSize_t len = stringLen(toTrim);

    XMLSize_t skip, scrape;
    for (skip = 0; skip < len; skip++)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[skip]))
            break;
    }

    for (scrape = len; scrape > skip; scrape--)
    {
        if (!XMLChar1_0::isWhitespace(toTrim[scrape - 1]))
            break;
    }

    // Cap off at the scrap point
    if (scrape != len)
        toTrim[scrape] = 0;

    if (skip)
    {
        // Copy the chars down
        XMLSize_t index = 0;
        while (toTrim[skip])
            toTrim[index++] = toTrim[skip++];

        toTrim[index] = 0;
    }
}